

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  int iVar1;
  undefined4 in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  
  *(long *)(in_RDI + 0x20) = in_RSI;
  *(long *)(in_RDI + 0x18) = in_RSI;
  *(long *)(in_RDI + 0x28) = in_RSI + in_EDX;
  *(undefined4 *)(in_RDI + 0x30) = in_ECX;
  iVar1 = stbi__parse_zlib((stbi__zbuf *)CONCAT44(in_EDX,in_ECX),in_R8D);
  return iVar1;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}